

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O0

QDataStream * operator<<(QDataStream *ds,QTimeZone *tz)

{
  bool bVar1;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  Data *unaff_retaddr;
  QDataStream *in_stack_00000008;
  anon_class_1_0_00000001 toQString;
  QTimeZone *in_stack_ffffffffffffffa8;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 uVar2;
  QDataStream *out;
  
  out = *(QDataStream **)(in_FS_OFFSET + 0x28);
  uVar2 = 0xaa;
  bVar1 = QTimeZone::isValid(in_stack_ffffffffffffffa8);
  if (bVar1) {
    QTimeZone::Data::operator<<
              (unaff_retaddr,out,
               (anon_class_1_0_00000001 *)CONCAT17(uVar2,in_stack_fffffffffffffff0));
  }
  else {
    invalidId();
    operator<<(in_stack_00000008,(QString *)&unaff_retaddr->s);
    QString::~QString((QString *)0x582494);
  }
  if (*(QDataStream **)(in_FS_OFFSET + 0x28) == out) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator<<(QDataStream &ds, const QTimeZone &tz)
{
    const auto toQString = [](const char *text) {
        return QString(QLatin1StringView(text));
    };
    if (tz.isValid())
        tz.d.serialize(ds, toQString);
    else
        ds << invalidId();
    return ds;
}